

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_view.h
# Opt level: O0

void __thiscall
bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
::increment(packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
            *this,size_t begin,size_t end,size_t n,overflow_opt opt)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  word_type wVar6;
  word_type wVar7;
  unsigned_long uVar8;
  bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *this_00;
  long in_RCX;
  long in_RDX;
  ulong uVar9;
  size_t in_RSI;
  packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *in_RDI;
  int in_R8D;
  word_type result;
  size_t p;
  size_t step;
  size_t rem;
  size_t len;
  size_t bits_per_word;
  size_t fields_per_word;
  size_t in_stack_ffffffffffffff48;
  unsigned_long in_stack_ffffffffffffff50;
  size_t local_98;
  unsigned_long local_58;
  ulong local_40;
  
  sVar2 = width(in_RDI);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2;
  sVar2 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40)) / auVar1,0);
  sVar3 = width(in_RDI);
  uVar4 = sVar2 * sVar3;
  sVar3 = in_RDX - in_RSI;
  sVar5 = width(in_RDI);
  local_40 = sVar3 * sVar5;
  uVar9 = local_40 % uVar4;
  sVar5 = width(in_RDI);
  local_58 = in_RSI * sVar5;
  while (uVar8 = local_58, sVar5 = width(in_RDI), uVar8 < in_RDX * sVar5) {
    local_98 = uVar4;
    if (local_40 < uVar4) {
      local_98 = uVar9;
    }
    wVar6 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::get
                      (&in_RDI->_bits,sVar2,uVar8);
    wVar7 = field_mask(in_RDI);
    uVar8 = lowbits<unsigned_long,void>(wVar7 * in_RCX,local_98);
    this_00 = (bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *)
              (wVar6 + uVar8);
    if (in_R8D == 1) {
      ensure_bitsize<unsigned_long,void>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    in_stack_ffffffffffffff50 = local_58;
    lowbits<unsigned_long,void>((unsigned_long)this_00,local_98);
    bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::set
              (this_00,in_RSI,sVar3,(word_type)in_RDI);
    local_40 = local_40 - local_98;
    local_58 = local_98 + local_58;
  }
  return;
}

Assistant:

void packed_view<C>::increment(size_t begin, size_t end,
                                       size_t n, overflow_opt opt)
        {
            size_t fields_per_word = W / width();
            size_t bits_per_word = fields_per_word * width(); // It's not useless
            size_t len = (end - begin) * width();
            size_t rem = len % bits_per_word;
            
            for(size_t step, p = begin * width();
                p < end * width();
                len -= step, p += step)
            {
                step = len < bits_per_word ? rem : bits_per_word;
                
                word_type result = _bits.get(p, p + step) +
                lowbits(field_mask() * n, step);
                
                if(opt == cant_overflow)
                    ensure_bitsize(result, step);
                
                _bits.set(p, p + step, lowbits(result, step));
            }
        }